

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O3

void consumer_mu_n(testing t,mu_queue *q,int start,int count)

{
  nsync_mu *mu;
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  ulong unaff_RBX;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  
  mu = &q->mu;
  uVar5 = 0;
  do {
    nsync::nsync_mu_lock(mu);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = unaff_RBX;
    iVar3 = nsync::nsync_mu_wait_with_deadline
                      ((nsync *)mu,(nsync_mu *)mu_queue_non_empty,(_func_int_void_ptr *)q,
                       (void *)0x0,(_func_int_void_ptr_void_ptr *)0x7fffffffffffffff,
                       (nsync_time)(auVar2 << 0x40),(nsync_note)0x3b9ac9ff);
    if (iVar3 == 0) {
      iVar3 = q->count;
      if (iVar3 == 0) {
        testing_panic("q->count == 0");
        iVar3 = q->count;
      }
      iVar1 = q->pos;
      pvVar7 = q->data[iVar1];
      q->data[iVar1] = (void *)0x0;
      q->pos = iVar1 + 1;
      q->count = iVar3 + -1;
      if (iVar1 + 1 == q->limit) {
        q->pos = 0;
      }
      nsync::nsync_mu_unlock(mu);
      if (pvVar7 == (void *)0x0) goto LAB_00103ea5;
    }
    else {
      nsync::nsync_mu_unlock(mu);
LAB_00103ea5:
      pcVar4 = smprintf("mu_queue_get() returned 0 with no deadline");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/mu_wait_test.c"
                     ,0x80,pcVar4);
      pvVar7 = (void *)0x0;
    }
    uVar6 = (int)pvVar7 - 0x10b189;
    if (uVar5 != uVar6) {
      pcVar4 = smprintf("mu_queue_get() returned bad value; want %d, got %d",(ulong)uVar5,
                        (ulong)uVar6);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/mu_wait_test.c"
                     ,0x85,pcVar4);
    }
    uVar5 = uVar5 + 3;
    if (uVar5 == 300000) {
      return;
    }
  } while( true );
}

Assistant:

static void consumer_mu_n (testing t, mu_queue *q, int start, int count) {
	int i;
	for (i = 0; i != count; i++) {
		void *v = mu_queue_get (q, nsync_time_no_deadline);
		int x;
		if (v == NULL) {
			TEST_FATAL (t, ("mu_queue_get() returned 0 with no deadline"));
		}
		x = PTR_TO_INT (v);
		if (x != (start+i)*3) {
			TEST_FATAL (t, ("mu_queue_get() returned bad value; want %d, got %d",
				   (start+i)*3, x));
		}
	}
}